

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindBlitCase::preCheck
          (InvalidateSubFboUnbindBlitCase *this)

{
  RenderTarget *pRVar1;
  NotSupportedError *pNVar2;
  allocator<char> local_39;
  string local_38;
  
  pRVar1 = Context::getRenderTarget((this->super_FboTestCase).super_TestCase.m_context);
  if (0 < pRVar1->m_numSamples) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Not supported in MSAA config",&local_39);
    tcu::NotSupportedError::NotSupportedError(pNVar2,&local_38);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_colorFmt != 0) {
    if (this->m_depthStencilFmt != 0) {
      FboTestCase::checkFormatSupport(&this->super_FboTestCase,this->m_colorFmt);
      FboTestCase::checkFormatSupport(&this->super_FboTestCase,this->m_depthStencilFmt);
      return;
    }
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unsupported depth/stencil format",&local_39);
    tcu::NotSupportedError::NotSupportedError(pNVar2,&local_38);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Unsupported color format",&local_39);
  tcu::NotSupportedError::NotSupportedError(pNVar2,&local_38);
  __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void preCheck (void)
	{
		if (m_context.getRenderTarget().getNumSamples() > 0)
			throw tcu::NotSupportedError("Not supported in MSAA config");

		if (m_colorFmt == GL_NONE)
			throw tcu::NotSupportedError("Unsupported color format");

		if (m_depthStencilFmt == GL_NONE)
			throw tcu::NotSupportedError("Unsupported depth/stencil format");

		checkFormatSupport(m_colorFmt);
		checkFormatSupport(m_depthStencilFmt);
	}